

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O2

ostream * __thiscall amrex::DistributionMapping::writeOn(DistributionMapping *this,ostream *os)

{
  element_type *peVar1;
  long lVar2;
  ostream *poVar3;
  int i;
  long lVar4;
  
  poVar3 = std::operator<<(os,'(');
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3,'\n');
  for (lVar4 = 0;
      peVar1 = (this->m_ref).
               super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr,
      lVar2 = *(long *)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl,
      lVar4 < (long)*(pointer *)
                     ((long)&(peVar1->m_pmap).super_vector<int,_std::allocator<int>_>.
                             super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) - lVar2 >> 2
      ; lVar4 = lVar4 + 1) {
    poVar3 = (ostream *)std::ostream::operator<<(os,*(int *)(lVar2 + lVar4 * 4));
    std::operator<<(poVar3,'\n');
  }
  std::operator<<(os,')');
  if (((byte)os[*(long *)(*(long *)os + -0x18) + 0x20] & 5) != 0) {
    Error_host("DistributionMapping::writeOn(ostream&) failed");
  }
  return os;
}

Assistant:

std::ostream&
DistributionMapping::writeOn (std::ostream& os) const
{
    os << '(' << size() << '\n';
    for (int i = 0; i < size(); ++i) {
        os << (*this)[i] << '\n';
    }
    os << ')';
    if (os.fail()) {
        amrex::Error("DistributionMapping::writeOn(ostream&) failed");
    }
    return os;
}